

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

double sptk::Warp(double omega,double alpha,double theta)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double y;
  double x;
  undefined8 local_8;
  
  if ((((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) || (in_XMM2_Qa != 0.0)) ||
     (local_8 = in_XMM0_Qa, NAN(in_XMM2_Qa))) {
    dVar1 = sin(in_XMM0_Qa - in_XMM2_Qa);
    dVar2 = cos(in_XMM0_Qa - in_XMM2_Qa);
    dVar1 = atan2(in_XMM1_Qa * dVar1,-in_XMM1_Qa * dVar2 + 1.0);
    dVar2 = sin(in_XMM0_Qa + in_XMM2_Qa);
    dVar3 = cos(in_XMM0_Qa + in_XMM2_Qa);
    local_8 = atan2(in_XMM1_Qa * dVar2,-in_XMM1_Qa * dVar3 + 1.0);
    local_8 = in_XMM0_Qa + dVar1 + local_8;
  }
  return local_8;
}

Assistant:

double Warp(double omega, double alpha, double theta) {
  if (0.0 == alpha && 0.0 == theta) return omega;
  const double x(omega - theta);
  const double y(omega + theta);
  return (omega + std::atan2(alpha * std::sin(x), 1.0 - alpha * std::cos(x)) +
          std::atan2(alpha * std::sin(y), 1.0 - alpha * std::cos(y)));
}